

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

BigNum * solve_system(BigNum *__return_storage_ptr__,
                     vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
                     *equations)

{
  pointer ppVar1;
  pointer piVar2;
  pointer piVar3;
  ostream *poVar4;
  pointer ppVar5;
  BigNum *result;
  BigNum all_mod;
  pair<BigNum,_BigNum> equation;
  BigNum new_first;
  pair<BigNum,_BigNum> local_340;
  BigNum local_300;
  pair<BigNum,_BigNum> local_2e0;
  int *local_2a0;
  pointer local_298;
  BigNum local_290;
  BigNum local_270;
  BigNum local_250;
  BigNum local_230;
  BigNum local_210;
  BigNum local_1f0;
  BigNum local_1d0;
  BigNum local_1b0;
  BigNum local_190;
  BigNum local_170;
  BigNum local_150;
  BigNum local_130;
  BigNum local_110;
  BigNum local_f0;
  BigNum local_d0;
  BigNum local_b0;
  BigNum local_90;
  BigNum local_70;
  BigNum local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Solving system of ",0x12);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," equations:",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  ppVar5 = (equations->
           super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (equations->
           super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar1) {
    do {
      std::pair<BigNum,_BigNum>::pair(&local_2e0,ppVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x = ",4);
      BigNum::BigNum(&local_50,&local_2e0.first);
      print(&local_50);
      if (local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (mod ",6);
      BigNum::BigNum(&local_70,&local_2e0.second);
      print(&local_70);
      if (local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,");",2);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
      if (local_2e0.second.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e0.second.digits.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2e0.second.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e0.second.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2e0.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e0.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_2e0.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e0.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
  }
  BigNum::BigNum(&local_300,1);
  BigNum::BigNum(__return_storage_ptr__,0);
  ppVar5 = (equations->
           super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_298 = (equations->
              super__Vector_base<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != local_298) {
    local_2a0 = &__return_storage_ptr__->length;
    do {
      std::pair<BigNum,_BigNum>::pair(&local_2e0,ppVar5);
      BigNum::BigNum(&local_190,&local_2e0.first);
      BigNum::BigNum(&local_90,__return_storage_ptr__);
      operator-(&local_290,&local_190,&local_90);
      piVar2 = local_190.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = local_190.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        piVar2 = local_190.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = local_190.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      while( true ) {
        if (piVar2 != (pointer)0x0) {
          operator_delete(piVar2,(long)piVar3 - (long)piVar2);
        }
        if (local_290.sign != false) break;
        BigNum::BigNum(&local_1b0,&local_290);
        BigNum::BigNum(&local_b0,&local_2e0.second);
        operator+(&local_340.first,&local_1b0,&local_b0);
        std::vector<int,_std::allocator<int>_>::operator=
                  (&local_290.digits,(vector<int,_std::allocator<int>_> *)&local_340);
        local_290.sign = local_340.first.sign;
        local_290.length = local_340.first.length;
        if (local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        piVar2 = local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_b0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          piVar2 = local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
      }
      BigNum::BigNum(&local_1d0,&local_290);
      BigNum::BigNum(&local_1f0,&local_300);
      BigNum::BigNum(&local_f0,&local_2e0.second);
      reverseByMod(&local_d0,&local_1f0,&local_f0);
      operator*(&local_340.first,&local_1d0,&local_d0);
      std::vector<int,_std::allocator<int>_>::operator=
                (&local_290.digits,(vector<int,_std::allocator<int>_> *)&local_340);
      local_290.sign = local_340.first.sign;
      local_290.length = local_340.first.length;
      if (local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      BigNum::BigNum(&local_210,&local_290);
      BigNum::BigNum(&local_110,&local_2e0.second);
      pairDivMod(&local_340,&local_210,&local_110);
      std::vector<int,_std::allocator<int>_>::operator=(&local_290.digits,&local_340.second.digits);
      local_290.sign = local_340.second.sign;
      local_290.length = local_340.second.length;
      if (local_340.second.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_340.second.digits.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_340.second.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_340.second.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_210.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_210.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_210.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_210.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      BigNum::BigNum(&local_230,__return_storage_ptr__);
      BigNum::BigNum(&local_250,&local_290);
      BigNum::BigNum(&local_150,&local_300);
      operator*(&local_130,&local_250,&local_150);
      operator+(&local_340.first,&local_230,&local_130);
      std::vector<int,_std::allocator<int>_>::operator=
                (&__return_storage_ptr__->digits,(vector<int,_std::allocator<int>_> *)&local_340);
      *(bool *)(local_2a0 + 1) = local_340.first.sign;
      *local_2a0 = local_340.first.length;
      if (local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_150.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_150.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_250.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_250.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_250.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_250.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_230.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_230.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_230.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_230.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      BigNum::BigNum(&local_270,&local_300);
      BigNum::BigNum(&local_170,&local_2e0.second);
      operator*(&local_340.first,&local_270,&local_170);
      std::vector<int,_std::allocator<int>_>::operator=
                (&local_300.digits,(vector<int,_std::allocator<int>_> *)&local_340);
      local_300.sign = local_340.first.sign;
      local_300.length = local_340.first.length;
      if (local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_340.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_170.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_170.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_170.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_170.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_270.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_270.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_290.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_290.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_290.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_290.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_2e0.second.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e0.second.digits.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2e0.second.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e0.second.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2e0.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e0.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_2e0.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e0.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != local_298);
  }
  if (local_300.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_300.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_300.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_300.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNum solve_system(vector<std::pair<BigNum, BigNum>> equations){ // num and mod
    cout << "Solving system of " << equations.size() << " equations:" << endl;
    for(auto equation : equations){
        cout << "x = ";
        print(equation.first);
        cout <<  " (mod ";
        print(equation.second);
        cout << ");" << endl;
    }
    BigNum all_mod = BigNum(1);
    BigNum result = BigNum(0);
    for (auto pr : equations){
        BigNum new_first = (pr.first - result);
        while (!new_first.sign){
            new_first = new_first + pr.second;
        }
        new_first = new_first * reverseByMod(all_mod, pr.second);
        new_first = pairDivMod(new_first, pr.second).second;
        result = result + new_first * all_mod; // 2 17
        all_mod = all_mod * pr.second; // 5 35
    }
    return result;
}